

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

void __thiscall
Centaurus::ATNMachine<unsigned_char>::drop_passthrough_nodes(ATNMachine<unsigned_char> *this)

{
  pointer pAVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  ulong __n;
  ATNTransition<unsigned_char> *t;
  pointer __x;
  reference rVar5;
  int where;
  allocator_type local_59;
  vector<bool,_std::allocator<bool>_> mask;
  
  where = CONCAT31(where._1_3_,1);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&mask,((long)(this->m_nodes).
                          super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_nodes).
                         super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x98,(bool *)&where,&local_59)
  ;
  __n = 1;
  do {
    if (((long)(this->m_nodes).
               super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_nodes).
              super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x98 - 1U <= __n) {
      filter_nodes(this,&mask);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&mask.super__Bvector_base<std::allocator<bool>_>);
      return;
    }
    pvVar3 = std::
             vector<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
             ::at(&this->m_nodes,__n);
    if (pvVar3->m_type == Blank) {
      where = -1;
      iVar2 = count_incoming_edges(this,(int)__n,&where);
      if (iVar2 == 1) {
        if ((long)where < 0) {
          __assert_fail("where >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/ATN.hpp"
                        ,0x179,
                        "void Centaurus::ATNMachine<unsigned char>::drop_passthrough_nodes() [TCHAR = unsigned char]"
                       );
        }
        pvVar4 = std::
                 vector<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                 ::at(&this->m_nodes,(long)where);
        pAVar1 = (pvVar3->m_transitions).
                 super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__x = (pvVar3->m_transitions).
                   super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __x != pAVar1; __x = __x + 1) {
          std::
          vector<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
          ::push_back(&pvVar4->m_transitions,__x);
        }
        rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&mask,__n);
        *rVar5._M_p = *rVar5._M_p & ~rVar5._M_mask;
      }
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

void drop_passthrough_nodes()
    {
        std::vector<bool> mask(m_nodes.size(), true);

        for (int i = 1; i < m_nodes.size() - 1; i++)
        {
            const ATNNode<TCHAR>& node = m_nodes.at(i);
            if (node.type() == ATNNodeType::Blank)
            {
                int where = -1;
                int count = count_incoming_edges(i, where);

                if (count == 1)
                {
                    assert(where >= 0);
                    ATNNode<TCHAR>& origin = m_nodes.at(where);
                    for (const auto& t : node.get_transitions())
                    {
                        origin.add_transition(t);
                    }
                    mask[i] = false;
                }
            }
        }

        filter_nodes(mask);
    }